

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightMask.hpp
# Opt level: O3

void __thiscall LightMask::forwardProp(LightMask *this,vector<float,_std::allocator<float>_> *walls)

{
  uint uVar1;
  int iVar2;
  pointer pfVar3;
  pointer pfVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  uVar1 = this->width_;
  lVar5 = (long)(int)uVar1;
  if (1 < lVar5) {
    pfVar3 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (walls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    fVar16 = *pfVar3;
    lVar9 = 1;
    do {
      fVar14 = pfVar4[lVar9] / 10.0 + this->falloff_;
      fVar15 = pfVar3[lVar9];
      if (1.0 <= fVar14) {
        fVar14 = 1.0;
      }
      if (fVar16 <= fVar15) {
        fVar16 = fVar15;
      }
      fVar17 = 0.0;
      if (0.0 <= fVar15) {
        fVar17 = fVar15;
      }
      if (fVar17 <= fVar16) {
        fVar17 = fVar16;
      }
      fVar16 = fVar17 - fVar14;
      if (fVar16 <= 0.0) {
        fVar16 = 0.0;
      }
      pfVar3[lVar9] = fVar16;
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  iVar2 = this->height_;
  if (1 < (long)iVar2) {
    pfVar3 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (walls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar6 = pfVar3 + 1;
    pfVar7 = pfVar4 + lVar5 + 1;
    lVar13 = 1;
    lVar9 = lVar5 << 0x20;
    do {
      lVar10 = lVar13 * lVar5;
      fVar16 = pfVar3[lVar10];
      fVar15 = pfVar4[lVar10] / 10.0 + this->falloff_;
      if (1.0 <= fVar15) {
        fVar15 = 1.0;
      }
      fVar14 = pfVar3[(lVar13 + -1) * lVar5];
      if (pfVar3[(lVar13 + -1) * lVar5] <= fVar16) {
        fVar14 = fVar16;
      }
      fVar17 = 0.0;
      if (0.0 <= fVar16) {
        fVar17 = fVar16;
      }
      if (fVar17 <= fVar14) {
        fVar17 = fVar14;
      }
      fVar17 = fVar17 - fVar15;
      if (fVar17 <= 0.0) {
        fVar17 = 0.0;
      }
      pfVar3[lVar10] = fVar17;
      pfVar8 = pfVar7;
      pfVar11 = pfVar6;
      lVar10 = lVar9;
      lVar12 = (ulong)uVar1 - 1;
      if (1 < (int)uVar1) {
        do {
          fVar16 = pfVar11[lVar5];
          fVar15 = *(float *)((long)pfVar3 + (lVar10 >> 0x1e));
          fVar14 = *pfVar8 / 10.0 + this->falloff_;
          if (1.0 <= fVar14) {
            fVar14 = 1.0;
          }
          if (fVar15 <= fVar16) {
            fVar15 = fVar16;
          }
          fVar17 = *pfVar11;
          if (*pfVar11 <= fVar16) {
            fVar17 = fVar16;
          }
          if (fVar17 <= fVar15) {
            fVar17 = fVar15;
          }
          fVar17 = fVar17 - fVar14;
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          pfVar11[lVar5] = fVar17;
          pfVar11 = pfVar11 + 1;
          lVar10 = lVar10 + 0x100000000;
          pfVar8 = pfVar8 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      lVar13 = lVar13 + 1;
      pfVar6 = pfVar6 + lVar5;
      lVar9 = lVar9 + (lVar5 << 0x20);
      pfVar7 = pfVar7 + lVar5;
    } while (lVar13 != iVar2);
  }
  return;
}

Assistant:

void forwardProp(const std::vector<float>& walls)
    {
        for (int x = 1; x < width_; x++)
        {
            // Only compare to pixel on the left
            mask[idx(x,0)] = computeIntensity(mask[idx(x,0)], mask[idx(x-1, 0)], 0.0f, walls[idx(x,0)]);
        }
        for (int y = 1; y < height_; y++)
        {
            // First pixel
            // Only compare to pixel above
            mask[idx(0,y)] = computeIntensity(mask[idx(0,y)], mask[idx(0, y-1)], 0.0f, walls[idx(0,y)] );

            // All other pixels: compare to pixel above and to the left
            for (int x = 1; x < width_; x++)
            {
                mask[idx(x,y)] = computeIntensity(
                        mask[ idx(x,   y)],
                        mask[ idx(x-1, y)],
                        mask[ idx(x,   y-1)],
                        walls[idx(x,   y)] );
            }
        }
    }